

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

void cs_impl::list_cs_ext::sort(list *lst,var *func)

{
  list<cs_impl::any,std::allocator<cs_impl::any>> *this;
  long lVar1;
  _List_node_base *p_Var2;
  long lVar3;
  list<cs_impl::any,std::allocator<cs_impl::any>> *plVar4;
  list<cs_impl::any,std::allocator<cs_impl::any>> *plVar5;
  __off64_t *in_R8;
  size_t in_R9;
  list<cs_impl::any,std::allocator<cs_impl::any>> *this_00;
  uint in_stack_fffffffffffff9a8;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> __carry;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> __tmp [64];
  
  p_Var2 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if ((p_Var2 != (_List_node_base *)lst) &&
     ((((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&p_Var2->_M_next)->_M_impl).
      _M_node.super__List_node_base._M_next != (_List_node_base *)lst)) {
    __carry.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&__carry;
    __carry.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node._M_size =
         0;
    lVar1 = 0;
    do {
      lVar3 = (long)&__tmp[0].super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                     _M_node.super__List_node_base._M_next + lVar1;
      *(long *)((long)&__tmp[0].super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                       _M_impl._M_node.super__List_node_base._M_prev + lVar1) = lVar3;
      *(long *)lVar3 = lVar3;
      *(undefined8 *)
       ((long)&__tmp[0].super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               _M_node._M_size + lVar1) = 0;
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x600);
    plVar5 = (list<cs_impl::any,std::allocator<cs_impl::any>> *)__tmp;
    __carry.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         __carry.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
         super__List_node_base._M_next;
    do {
      plVar4 = plVar5;
      std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::splice
                (&__carry,(int)__carry.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                               ._M_impl._M_node.super__List_node_base._M_next,(__off64_t *)lst,
                 (int)p_Var2,in_R8,in_R9,in_stack_fffffffffffff9a8);
      for (this_00 = (list<cs_impl::any,std::allocator<cs_impl::any>> *)__tmp; this_00 != plVar4;
          this_00 = this_00 + 0x18) {
        if (this_00 == *(list<cs_impl::any,std::allocator<cs_impl::any>> **)this_00) {
          lVar1 = 0;
          plVar5 = this_00;
          goto LAB_0018c6a6;
        }
        std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
        merge<cs_impl::list_cs_ext::sort(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)::__0>
                  (this_00,&__carry,(anon_class_8_1_898bcfc2)func);
        std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::swap
                  (&__carry,(list<cs_impl::any,_std::allocator<cs_impl::any>_> *)this_00);
      }
      lVar1 = 0x18;
      plVar5 = plVar4;
LAB_0018c6a6:
      std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::swap
                (&__carry,(list<cs_impl::any,_std::allocator<cs_impl::any>_> *)plVar5);
      p_Var2 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      plVar5 = plVar4 + lVar1;
    } while (p_Var2 != (_List_node_base *)lst);
    plVar5 = (list<cs_impl::any,std::allocator<cs_impl::any>> *)__tmp;
    while (this = plVar5 + 0x18, this != plVar4 + lVar1) {
      std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
      merge<cs_impl::list_cs_ext::sort(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)::__0>
                (this,(list<cs_impl::any,_std::allocator<cs_impl::any>_> *)plVar5,
                 (anon_class_8_1_898bcfc2)func);
      plVar5 = this;
    }
    plVar5 = plVar4 + -0x18;
    if (this_00 == plVar4) {
      plVar5 = plVar4;
    }
    std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::swap
              (lst,(list<cs_impl::any,_std::allocator<cs_impl::any>_> *)plVar5);
    lVar1 = 0x5e8;
    do {
      std::__cxx11::_List_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_clear
                ((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                 ((long)&__tmp[0].super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                         _M_impl._M_node.super__List_node_base._M_next + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    std::__cxx11::_List_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_clear
              (&__carry.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>);
  }
  return;
}

Assistant:

char get(istream &in)
		{
			return in->get();
		}